

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O1

void jinit_1pass_quantizer(j_decompress_ptr cinfo)

{
  uint uVar1;
  J_COLOR_SPACE JVar2;
  jpeg_color_quantizer *pjVar3;
  ulong uVar4;
  jpeg_error_mgr *pjVar5;
  JSAMPARRAY ppJVar6;
  bool bVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  JDIMENSION JVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  undefined4 uVar17;
  long lVar18;
  undefined1 auVar19 [16];
  uint uVar20;
  uint uVar22;
  uint uVar23;
  int iVar24;
  undefined1 auVar21 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  uint uVar29;
  undefined1 auVar27 [16];
  uint uVar30;
  undefined1 auVar28 [16];
  undefined1 auVar31 [16];
  uint uVar32;
  uint uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  int local_60 [4];
  jpeg_color_quantizer *local_50;
  j_decompress_ptr local_48;
  long local_40;
  ulong local_38;
  
  pjVar3 = (jpeg_color_quantizer *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x98);
  cinfo->cquantize = pjVar3;
  pjVar3->start_pass = start_pass_1_quant;
  pjVar3->finish_pass = finish_pass_1_quant;
  pjVar3->new_color_map = new_color_map_1_quant;
  pjVar3[3].finish_pass = (_func_void_j_decompress_ptr *)0x0;
  pjVar3[2].finish_pass = (_func_void_j_decompress_ptr *)0x0;
  if (4 < cinfo->out_color_components) {
    *(undefined8 *)&cinfo->err->msg_code = 0x400000037;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if (0x100 < cinfo->desired_number_of_colors) {
    *(undefined8 *)&cinfo->err->msg_code = 0x10000000039;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  pjVar3 = cinfo->cquantize;
  uVar1 = cinfo->out_color_components;
  lVar16 = (long)cinfo->desired_number_of_colors;
  JVar2 = cinfo->out_color_space;
  local_60[1] = rgb_red[JVar2];
  local_60[0] = rgb_green[JVar2];
  local_60[2] = rgb_blue[JVar2];
  uVar10 = 1;
  do {
    uVar4 = uVar10;
    uVar10 = uVar4 + 1;
    uVar8 = uVar10;
    iVar14 = uVar1 - 1;
    if (1 < (int)uVar1) {
      do {
        uVar8 = uVar8 * uVar10;
        iVar14 = iVar14 + -1;
      } while (iVar14 != 0);
    }
  } while ((long)uVar8 <= lVar16);
  if (uVar4 < 2) {
    pjVar5 = cinfo->err;
    pjVar5->msg_code = 0x38;
    (pjVar5->msg_parm).i[0] = (int)uVar8;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  auVar21 = _DAT_00160a40;
  if ((int)uVar1 < 1) {
    uVar10 = 1;
  }
  else {
    lVar9 = (ulong)uVar1 - 1;
    auVar19._8_4_ = (int)lVar9;
    auVar19._0_8_ = lVar9;
    auVar19._12_4_ = (int)((ulong)lVar9 >> 0x20);
    uVar17 = (undefined4)uVar4;
    lVar9 = 0;
    auVar19 = auVar19 ^ _DAT_00160a40;
    auVar25 = _DAT_00161d90;
    auVar26 = _DAT_00160a30;
    auVar27 = _DAT_001625b0;
    do {
      auVar34 = auVar27;
      auVar27 = auVar26 ^ auVar21;
      uVar20 = -(uint)(auVar19._0_4_ < auVar27._0_4_);
      iVar14 = auVar19._4_4_;
      uVar22 = -(uint)(iVar14 < auVar27._4_4_);
      uVar23 = -(uint)(auVar19._8_4_ < auVar27._8_4_);
      iVar15 = auVar19._12_4_;
      iVar24 = -(uint)(iVar15 < auVar27._12_4_);
      uVar29 = -(uint)(auVar27._4_4_ == iVar14);
      uVar30 = -(uint)(auVar27._12_4_ == iVar15);
      if ((~(uVar22 | uVar29 & uVar20) & 1) != 0) {
        *(undefined4 *)((long)&pjVar3[1].new_color_map + lVar9 + 4) = uVar17;
      }
      if (((((ushort)iVar24 | (ushort)uVar30 & (ushort)uVar23) ^ 0xffff) & 1) != 0) {
        *(undefined4 *)((long)&pjVar3[2].start_pass + lVar9) = uVar17;
      }
      auVar27 = auVar25 ^ auVar21;
      auVar31._0_4_ = -(uint)(auVar19._0_4_ < auVar27._0_4_);
      auVar31._4_4_ = -(uint)(iVar14 < auVar27._4_4_);
      auVar31._8_4_ = -(uint)(auVar19._8_4_ < auVar27._8_4_);
      auVar31._12_4_ = -(uint)(iVar15 < auVar27._12_4_);
      uVar32 = -(uint)(auVar27._4_4_ == iVar14);
      uVar33 = -(uint)(auVar27._12_4_ == iVar15);
      auVar38._4_4_ = uVar32;
      auVar38._0_4_ = uVar32;
      auVar38._8_4_ = uVar33;
      auVar38._12_4_ = uVar33;
      auVar35._4_4_ = auVar31._4_4_;
      auVar35._0_4_ = auVar31._4_4_;
      auVar35._8_4_ = auVar31._12_4_;
      auVar35._12_4_ = auVar31._12_4_;
      auVar36._8_4_ = 0xffffffff;
      auVar36._0_8_ = 0xffffffffffffffff;
      auVar36._12_4_ = 0xffffffff;
      auVar36 = (auVar35 | auVar38 & auVar31) ^ auVar36;
      if ((auVar36 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined4 *)((long)&pjVar3[2].start_pass + lVar9 + 4) = uVar17;
      }
      if ((auVar36 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined4 *)((long)&pjVar3[2].color_quantize + lVar9) = uVar17;
      }
      auVar27._0_4_ = (undefined4)((ulong)auVar34._0_4_ * (uVar4 & 0xffffffff));
      auVar37._8_4_ = (undefined4)((auVar34._8_8_ & 0xffffffff) * (uVar4 & 0xffffffff));
      auVar37._4_4_ = auVar37._8_4_;
      auVar37._0_4_ = auVar27._0_4_;
      auVar37._12_4_ = (int)((ulong)auVar34._12_4_ * (uVar4 & 0xffffffff));
      auVar27._8_8_ = auVar37._8_8_;
      auVar27._4_4_ = (int)((ulong)auVar34._4_4_ * (uVar4 & 0xffffffff));
      lVar12 = auVar26._8_8_;
      auVar26._0_8_ = auVar26._0_8_ + 4;
      auVar26._8_8_ = lVar12 + 4;
      lVar12 = auVar25._8_8_;
      auVar25._0_8_ = auVar25._0_8_ + 4;
      auVar25._8_8_ = lVar12 + 4;
      lVar9 = lVar9 + 0x10;
    } while ((ulong)(uVar1 + 3 >> 2) << 4 != lVar9);
    auVar28._0_4_ = uVar29 & uVar20;
    auVar28._4_4_ = uVar30 & uVar23;
    auVar28._8_4_ = uVar32 & auVar31._0_4_;
    auVar28._12_4_ = uVar33 & auVar31._8_4_;
    auVar21._4_4_ = iVar24;
    auVar21._0_4_ = uVar22;
    auVar21._8_4_ = auVar31._4_4_;
    auVar21._12_4_ = auVar31._12_4_;
    auVar21 = ~(auVar21 | auVar28) & auVar27 | auVar34 & (auVar21 | auVar28);
    uVar10 = ((ulong)auVar21._8_4_ * (ulong)auVar21._0_4_ & 0xffffffff) *
             ((ulong)auVar21._4_4_ * (ulong)auVar21._12_4_ & 0xffffffff) & 0xffffffff;
  }
  do {
    bVar7 = true;
    if (0 < (int)uVar1) {
      uVar8 = 0;
      do {
        if (cinfo->out_color_space == JCS_RGB) {
          iVar14 = local_60[uVar8];
        }
        else {
          iVar14 = (int)uVar8;
        }
        iVar15 = *(int *)((long)&pjVar3[1].new_color_map + (long)iVar14 * 4 + 4);
        lVar9 = (long)iVar15 + 1;
        uVar4 = ((int)uVar10 / iVar15) * lVar9;
        if (uVar4 - lVar16 != 0 && lVar16 <= (long)uVar4) break;
        *(int *)((long)&pjVar3[1].new_color_map + (long)iVar14 * 4 + 4) = (int)lVar9;
        uVar8 = uVar8 + 1;
        bVar7 = false;
        uVar10 = uVar4 & 0xffffffff;
      } while (uVar1 != uVar8);
    }
    if (bVar7) {
      pjVar5 = cinfo->err;
      JVar13 = (JDIMENSION)uVar10;
      if (cinfo->out_color_components == 3) {
        (pjVar5->msg_parm).i[0] = JVar13;
        (pjVar5->msg_parm).i[1] = *(int *)((long)&pjVar3[1].new_color_map + 4);
        (pjVar5->msg_parm).i[2] = *(int *)&pjVar3[2].start_pass;
        (pjVar5->msg_parm).i[3] = *(int *)((long)&pjVar3[2].start_pass + 4);
        pjVar5->msg_code = 0x5e;
      }
      else {
        pjVar5->msg_code = 0x5f;
        (pjVar5->msg_parm).i[0] = JVar13;
        pjVar5 = cinfo->err;
      }
      (*pjVar5->emit_message)((j_common_ptr)cinfo,1);
      ppJVar6 = (*cinfo->mem->alloc_sarray)
                          ((j_common_ptr)cinfo,1,JVar13,cinfo->out_color_components);
      if (0 < cinfo->out_color_components) {
        lVar16 = 0;
        do {
          iVar14 = *(int *)((long)&pjVar3[1].new_color_map + lVar16 * 4 + 4);
          lVar9 = (long)iVar14;
          iVar15 = (int)uVar10;
          uVar8 = (long)iVar15 / (long)iVar14;
          uVar10 = uVar8 & 0xffffffff;
          iVar14 = (int)uVar8;
          if (0 < lVar9) {
            local_38 = lVar9 - 1;
            local_40 = (long)((int)(((uint)(local_38 >> 0x1f) & 1) + (int)local_38) >> 1);
            lVar12 = 0;
            lVar18 = 0;
            do {
              if (lVar12 * iVar14 < (long)(int)JVar13) {
                lVar11 = lVar18;
                do {
                  if (0 < iVar14) {
                    uVar4 = 0;
                    do {
                      ppJVar6[lVar16][uVar4 + lVar11] =
                           (JSAMPLE)((lVar12 * 0xff + local_40) / (long)local_38);
                      uVar4 = uVar4 + 1;
                    } while ((uVar8 & 0xffffffff) != uVar4);
                  }
                  lVar11 = lVar11 + iVar15;
                } while (lVar11 < (int)JVar13);
              }
              lVar12 = lVar12 + 1;
              lVar18 = lVar18 + iVar14;
            } while (lVar12 != lVar9);
          }
          lVar16 = lVar16 + 1;
          local_50 = pjVar3;
          local_48 = cinfo;
        } while (lVar16 < cinfo->out_color_components);
      }
      pjVar3[1].start_pass = (_func_void_j_decompress_ptr_boolean *)ppJVar6;
      *(JDIMENSION *)&pjVar3[1].color_quantize = JVar13;
      create_colorindex(cinfo);
      if (cinfo->dither_mode != JDITHER_FS) {
        return;
      }
      alloc_fs_workspace(cinfo);
      return;
    }
  } while( true );
}

Assistant:

GLOBAL(void)
jinit_1pass_quantizer(j_decompress_ptr cinfo)
{
  my_cquantize_ptr cquantize;

  cquantize = (my_cquantize_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(my_cquantizer));
  cinfo->cquantize = (struct jpeg_color_quantizer *)cquantize;
  cquantize->pub.start_pass = start_pass_1_quant;
  cquantize->pub.finish_pass = finish_pass_1_quant;
  cquantize->pub.new_color_map = new_color_map_1_quant;
  cquantize->fserrors[0] = NULL; /* Flag FS workspace not allocated */
  cquantize->odither[0] = NULL; /* Also flag odither arrays not allocated */

  /* Make sure my internal arrays won't overflow */
  if (cinfo->out_color_components > MAX_Q_COMPS)
    ERREXIT1(cinfo, JERR_QUANT_COMPONENTS, MAX_Q_COMPS);
  /* Make sure colormap indexes can be represented by JSAMPLEs */
  if (cinfo->desired_number_of_colors > (MAXJSAMPLE + 1))
    ERREXIT1(cinfo, JERR_QUANT_MANY_COLORS, MAXJSAMPLE + 1);

  /* Create the colormap and color index table. */
  create_colormap(cinfo);
  create_colorindex(cinfo);

  /* Allocate Floyd-Steinberg workspace now if requested.
   * We do this now since it may affect the memory manager's space
   * calculations.  If the user changes to FS dither mode in a later pass, we
   * will allocate the space then, and will possibly overrun the
   * max_memory_to_use setting.
   */
  if (cinfo->dither_mode == JDITHER_FS)
    alloc_fs_workspace(cinfo);
}